

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O1

void Gia_ManHashResize(Gia_Man_t *p)

{
  Vec_Int_t *pVVar1;
  uint uVar2;
  int *__ptr;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  uint uVar5;
  int *piVar6;
  ulong uVar7;
  uint *puVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  
  uVar2 = (p->vHTable).nSize;
  if ((int)uVar2 < 1) {
    __assert_fail("Vec_IntSize(&vOld) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                  ,0xaa,"void Gia_ManHashResize(Gia_Man_t *)");
  }
  pVVar1 = &p->vHTable;
  __ptr = (p->vHTable).pArray;
  pVVar1->nCap = 0;
  pVVar1->nSize = 0;
  (p->vHTable).pArray = (int *)0x0;
  uVar7 = (ulong)((~(p->vCos->nSize + p->vCis->nSize) + p->nObjs) * 2 - 1);
  while( true ) {
    do {
      uVar12 = (uint)uVar7;
      uVar11 = uVar12 + 1;
      uVar16 = (ulong)uVar11;
      uVar14 = uVar7 & 1;
      uVar7 = uVar16;
    } while (uVar14 != 0);
    if (uVar11 < 9) break;
    iVar9 = 5;
    while( true ) {
      if (uVar11 % (iVar9 - 2U) == 0) break;
      uVar5 = iVar9 * iVar9;
      iVar9 = iVar9 + 2;
      if (uVar11 < uVar5) goto LAB_002099c7;
    }
  }
LAB_002099c7:
  if (pVVar1->nCap < (int)uVar11) {
    piVar6 = (p->vHTable).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar11 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar11 << 2);
    }
    (p->vHTable).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar1->nCap = uVar11;
  }
  if (uVar12 < 0x7fffffff) {
    memset((p->vHTable).pArray,0,uVar16 << 2);
  }
  (p->vHTable).nSize = uVar11;
  uVar7 = 1;
  if (1 < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  uVar14 = 0;
  iVar9 = 0;
  while( true ) {
    iVar15 = __ptr[uVar14];
    uVar16 = (ulong)iVar15;
    if (((long)uVar16 < 0) || ((p->vHash).nSize <= iVar15)) break;
    if (iVar15 != 0) {
      puVar8 = (uint *)((p->vHash).pArray + uVar16);
      do {
        iVar15 = (int)uVar16;
        if ((iVar15 < 0) || (p->nObjs <= iVar15)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((p->vHash).nSize <= iVar15) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar2 = *puVar8;
        uVar16 = uVar16 & 0xffffffff;
        pGVar3 = p->pObjs;
        (p->vHash).pArray[uVar16] = 0;
        uVar4 = *(ulong *)(pGVar3 + uVar16);
        iVar10 = iVar15 - ((uint)uVar4 & 0x1fffffff);
        if ((iVar10 < 0) ||
           (uVar12 = (uint)(uVar4 >> 0x20), iVar13 = iVar15 - (uVar12 & 0x1fffffff), iVar13 < 0)) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        if (p->pMuxes == (uint *)0x0) {
          uVar11 = 0xffffffff;
        }
        else {
          if (p->nObjs <= iVar15) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar11 = p->pMuxes[uVar16];
          uVar11 = -(uint)(uVar11 == 0) | uVar11;
        }
        piVar6 = Gia_ManHashFind(p,((uint)(uVar4 >> 0x1d) & 1) + iVar10 * 2,
                                 (uVar12 >> 0x1d & 1) + iVar13 * 2,uVar11);
        if (*piVar6 != 0) {
          __assert_fail("*pPlace == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                        ,0xb8,"void Gia_ManHashResize(Gia_Man_t *)");
        }
        *piVar6 = iVar15;
        if (((int)uVar2 < 0) || ((p->vHash).nSize <= (int)uVar2)) goto LAB_00209b90;
        puVar8 = (uint *)((p->vHash).pArray + uVar2);
        iVar9 = iVar9 + 1;
        uVar16 = (ulong)uVar2;
      } while ((ulong)uVar2 != 0);
    }
    uVar14 = uVar14 + 1;
    if (uVar14 == uVar7) {
      if (iVar9 != (~(p->vCos->nSize + p->vCis->nSize) + p->nObjs) - p->nBufs) {
        __assert_fail("Counter == Counter2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                      ,0xbe,"void Gia_ManHashResize(Gia_Man_t *)");
      }
      if (__ptr != (int *)0x0) {
        free(__ptr);
        return;
      }
      return;
    }
  }
LAB_00209b90:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManHashResize( Gia_Man_t * p )
{
    int i, iThis, iNext, Counter, Counter2, * pPlace;
    Vec_Int_t vOld = p->vHTable;
    assert( Vec_IntSize(&vOld) > 0 );
    // replace the table
    Vec_IntZero( &p->vHTable );
    Vec_IntFill( &p->vHTable, Abc_PrimeCudd( 2 * Gia_ManAndNum(p) ), 0 ); 
    // rehash the entries from the old table
    Counter = 0;
    Vec_IntForEachEntry( &vOld, iThis, i )
        for ( iNext = Vec_IntEntry(&p->vHash, iThis);  
              iThis;  iThis = iNext,   
              iNext = Vec_IntEntry(&p->vHash, iThis)  )
        {
            Gia_Obj_t * pThis0 = Gia_ManObj( p, iThis );
            Vec_IntWriteEntry( &p->vHash, iThis, 0 );
            pPlace = Gia_ManHashFind( p, Gia_ObjFaninLit0(pThis0, iThis), Gia_ObjFaninLit1(pThis0, iThis), Gia_ObjFaninLit2p(p, pThis0) );
            assert( *pPlace == 0 ); // should not be there
            *pPlace = iThis;
            assert( *pPlace != 0 );
            Counter++;
        }
    Counter2 = Gia_ManAndNum(p) - Gia_ManBufNum(p);
    assert( Counter == Counter2 );
//    if ( p->fVerbose )
//        printf( "Resizing GIA hash table: %d -> %d.\n", Vec_IntSize(&vOld), Vec_IntSize(&p->vHTable) );
    Vec_IntErase( &vOld );
}